

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  *(undefined ***)&(this->super_IfcStyleModel).field_0xa0 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcStyledRepresentation";
  IfcStyleModel::IfcStyleModel(&this->super_IfcStyleModel,&PTR_construction_vtable_24__0085a508);
  (this->super_IfcStyleModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x85a478;
  *(undefined8 *)&(this->super_IfcStyleModel).field_0xa0 = 0x85a4f0;
  *(undefined8 *)&(this->super_IfcStyleModel).super_IfcRepresentation.field_0x80 = 0x85a4a0;
  *(undefined8 *)&(this->super_IfcStyleModel).super_IfcRepresentation.field_0x90 = 0x85a4c8;
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}